

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monmove.c
# Opt level: O0

boolean mb_trapped(monst *mtmp)

{
  int iVar1;
  monst *mtmp_local;
  
  if (flags.verbose != '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (flags.soundok != '\0') {
        You_hear("a distant explosion.");
      }
    }
    else {
      pline("KABOOM!!  You see a door explode.");
    }
  }
  wake_nearto((int)mtmp->mx,(int)mtmp->my,0x31);
  *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xffefffff | 0x100000;
  iVar1 = rnd(0xf);
  mtmp->mhp = mtmp->mhp - iVar1;
  if (mtmp->mhp < 1) {
    mondied(mtmp);
    if (mtmp->mhp < 1) {
      mtmp_local._7_1_ = '\x01';
    }
    else {
      mtmp_local._7_1_ = '\0';
    }
  }
  else {
    mtmp_local._7_1_ = '\0';
  }
  return mtmp_local._7_1_;
}

Assistant:

boolean mb_trapped(struct monst *mtmp)
{
	if (flags.verbose) {
	    if (cansee(mtmp->mx, mtmp->my))
		pline("KABOOM!!  You see a door explode.");
	    else if (flags.soundok)
		You_hear("a distant explosion.");
	}
	wake_nearto(mtmp->mx, mtmp->my, 7*7);
	mtmp->mstun = 1;
	mtmp->mhp -= rnd(15);
	if (mtmp->mhp <= 0) {
		mondied(mtmp);
		if (mtmp->mhp > 0) /* lifesaved */
			return FALSE;
		else
			return TRUE;
	}
	return FALSE;
}